

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

void __thiscall S2Loop::InitOriginAndBound(S2Loop *this)

{
  bool bVar1;
  bool bVar2;
  S2Point *pSVar3;
  S2Point *c;
  S2Point *o;
  S2Point local_40;
  
  if (this->num_vertices_ < 3) {
    if (this->num_vertices_ != 1) {
      this->origin_inside_ = false;
      return;
    }
    pSVar3 = vertex(this,0);
    this->origin_inside_ = pSVar3->c_[2] <= 0.0 && pSVar3->c_[2] != 0.0;
  }
  else {
    this->origin_inside_ = false;
    pSVar3 = vertex(this,1);
    S2::Ortho(&local_40,pSVar3);
    pSVar3 = vertex(this,0);
    c = vertex(this,2);
    o = vertex(this,1);
    bVar1 = s2pred::OrderedCCW(&local_40,pSVar3,c,o);
    pSVar3 = vertex(this,1);
    bVar2 = Contains(this,pSVar3);
    if (bVar1 != bVar2) {
      this->origin_inside_ = true;
    }
  }
  InitBound(this);
  InitIndex(this);
  return;
}

Assistant:

void S2Loop::InitOriginAndBound() {
  if (num_vertices() < 3) {
    // Check for the special empty and full loops (which have one vertex).
    if (!is_empty_or_full()) {
      origin_inside_ = false;
      return;  // Bail out without trying to access non-existent vertices.
    }
    // If the vertex is in the southern hemisphere then the loop is full,
    // otherwise it is empty.
    origin_inside_ = (vertex(0).z() < 0);
  } else {
    // Point containment testing is done by counting edge crossings starting
    // at a fixed point on the sphere (S2::Origin()).  Historically this was
    // important, but it is now no longer necessary, and it may be worthwhile
    // experimenting with using a loop vertex as the reference point.  In any
    // case, we need to know whether the reference point (S2::Origin) is
    // inside or outside the loop before we can construct the S2ShapeIndex.
    // We do this by first guessing that it is outside, and then seeing
    // whether we get the correct containment result for vertex 1.  If the
    // result is incorrect, the origin must be inside the loop.
    //
    // A loop with consecutive vertices A,B,C contains vertex B if and only if
    // the fixed vector R = S2::Ortho(B) is contained by the wedge ABC.  The
    // wedge is closed at A and open at C, i.e. the point B is inside the loop
    // if A=R but not if C=R.  This convention is required for compatibility
    // with S2::VertexCrossing.  (Note that we can't use S2::Origin()
    // as the fixed vector because of the possibility that B == S2::Origin().)
    //
    // TODO(ericv): Investigate using vertex(0) as the reference point.

    origin_inside_ = false;  // Initialize before calling Contains().
    bool v1_inside = s2pred::OrderedCCW(S2::Ortho(vertex(1)), vertex(0),
                                        vertex(2), vertex(1));
    // Note that Contains(S2Point) only does a bounds check once InitIndex()
    // has been called, so it doesn't matter that bound_ is undefined here.
    if (v1_inside != Contains(vertex(1))) {
      origin_inside_ = true;
    }
  }
  // We *must* call InitBound() before InitIndex(), because InitBound() calls
  // Contains(S2Point), and Contains(S2Point) does a bounds check whenever the
  // index is not fresh (i.e., the loop has been added to the index but the
  // index has not been updated yet).
  //
  // TODO(ericv): When fewer S2Loop methods depend on internal bounds checks,
  // consider computing the bound on demand as well.
  InitBound();
  InitIndex();
}